

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

int __thiscall
boost::runtime::cla::parser::parse(parser *this,int argc,char **argv,arguments_store *res)

{
  bool bVar1;
  int extraout_EAX;
  key_type *__k;
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  *this_00;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *this_01;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *psVar2;
  type pbVar3;
  argv_traverser *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double in_XMM1_Qa;
  cstring *in_stack_00000048;
  cstring *in_stack_00000050;
  trie_ptr *in_stack_00000058;
  parser *in_stack_00000060;
  cstring value;
  basic_param_ptr found_param;
  parameter_cla_id *found_id;
  locate_result locate_res;
  trie_ptr curr_trie;
  bool negative_form;
  cstring value_separator;
  cstring name;
  cstring prefix;
  cstring curr_token;
  argv_traverser tr;
  iterator it;
  cstring path_sep;
  type in_stack_fffffffffffff908;
  undefined6 in_stack_fffffffffffff910;
  byte in_stack_fffffffffffff916;
  undefined1 in_stack_fffffffffffff917;
  argv_traverser *in_stack_fffffffffffff918;
  undefined6 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff926;
  undefined1 in_stack_fffffffffffff927;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
  *in_stack_fffffffffffff928;
  undefined5 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff935;
  undefined1 in_stack_fffffffffffff936;
  undefined1 in_stack_fffffffffffff937;
  char *in_stack_fffffffffffff938;
  basic_cstring<const_char> local_690 [16];
  bool *in_stack_fffffffffffffa70;
  cstring *in_stack_fffffffffffffa78;
  cstring *in_stack_fffffffffffffa80;
  cstring *in_stack_fffffffffffffa88;
  cstring *in_stack_fffffffffffffa90;
  parser *in_stack_fffffffffffffa98;
  self_type local_400 [20];
  basic_cstring<const_char> local_2b8 [17];
  undefined1 *local_1a8;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190 [2];
  undefined1 local_170 [124];
  undefined4 local_f4;
  basic_cstring<const_char> local_f0 [2];
  basic_cstring<const_char> local_d0;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> local_c0;
  basic_cstring<const_char> local_b0;
  byte local_99;
  basic_cstring<const_char> local_98;
  basic_cstring<const_char> local_88;
  basic_cstring<const_char> local_78;
  basic_cstring<const_char> local_68;
  argv_traverser local_58;
  specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *local_38;
  basic_cstring<const_char> local_30;
  argv_traverser *local_20;
  
  local_20 = in_RCX;
  unit_test::basic_cstring<const_char>::operator=
            ((basic_cstring<const_char> *)
             CONCAT17(in_stack_fffffffffffff927,
                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
             (pointer)in_stack_fffffffffffff918);
  unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)
             CONCAT17(in_stack_fffffffffffff937,
                      CONCAT16(in_stack_fffffffffffff936,
                               CONCAT15(in_stack_fffffffffffff935,in_stack_fffffffffffff930))),
             (pointer)in_stack_fffffffffffff928);
  __k = (key_type *)unit_test::basic_cstring<const_char>::begin((basic_cstring<const_char> *)in_RDI)
  ;
  this_00 = (map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
             *)unit_test::basic_cstring<const_char>::end((basic_cstring<const_char> *)in_RDI);
  unit_test::basic_cstring<const_char>::begin(&local_30);
  unit_test::basic_cstring<const_char>::end(&local_30);
  this_01 = (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
            unit_test::utils::find_last_of<char_const*,char_const*>
                      (in_stack_fffffffffffff938,
                       (char *)CONCAT17(in_stack_fffffffffffff937,
                                        CONCAT16(in_stack_fffffffffffff936,
                                                 CONCAT15(in_stack_fffffffffffff935,
                                                          in_stack_fffffffffffff930))),
                       (char *)in_stack_fffffffffffff928,
                       (char *)CONCAT17(in_stack_fffffffffffff927,
                                        CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920
                                                )));
  local_38 = this_01;
  psVar2 = (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
           unit_test::basic_cstring<const_char>::end((basic_cstring<const_char> *)in_RDI);
  if (this_01 != psVar2) {
    unit_test::basic_cstring<const_char>::trim_left
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
               (iterator)in_stack_fffffffffffff908);
  }
  argv_traverser::argv_traverser
            ((argv_traverser *)
             CONCAT17(in_stack_fffffffffffff917,
                      CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
             (int)((ulong)in_stack_fffffffffffff908 >> 0x20),(argv_type)0x2449d9);
  do {
    bVar1 = argv_traverser::eoi(&local_58);
    __x = extraout_XMM0_Qa;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00245552:
      argv_traverser::remainder(&local_58,__x,in_XMM1_Qa);
      return extraout_EAX;
    }
    argv_traverser::current_token(in_stack_fffffffffffff918);
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
    local_99 = 0;
    unit_test::basic_cstring<const_char>::basic_cstring(&local_b0,&local_68);
    bVar1 = validate_token_format
                      (in_stack_fffffffffffffa98,in_stack_fffffffffffffa90,in_stack_fffffffffffffa88
                       ,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                       in_stack_fffffffffffffa70);
    if (!bVar1) {
      argv_traverser::next_token
                ((argv_traverser *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      __x = extraout_XMM0_Qa_00;
      goto LAB_00245552;
    }
    std::
    map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
    ::operator[](this_00,__k);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
               (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               in_stack_fffffffffffff908);
    bVar1 = shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::operator!(&local_c0);
    if (bVar1) {
      unit_test::basic_cstring<const_char>::basic_cstring
                (&local_d0,(basic_cstring<const_char> *)in_RDI);
      unit_test::basic_cstring<const_char>::basic_cstring(local_f0,&local_68);
      rt_cla_detail::report_foreing_token
                ((cstring *)
                 CONCAT17(in_stack_fffffffffffff927,
                          CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                 (cstring *)in_stack_fffffffffffff918);
      argv_traverser::save_token
                ((argv_traverser *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      local_f4 = 2;
    }
    else {
      unit_test::basic_cstring<const_char>::size(&local_78);
      unit_test::basic_cstring<const_char>::trim_left
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                 (size_type)in_stack_fffffffffffff908);
      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
                ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                 (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
                 in_stack_fffffffffffff908);
      unit_test::basic_cstring<const_char>::basic_cstring(local_190,&local_88);
      unit_test::basic_cstring<const_char>::basic_cstring(&local_1a0,&local_68);
      locate_parameter(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
      shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
                ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x244be9);
      local_1a8 = local_170;
      shared_ptr<boost::runtime::basic_param>::shared_ptr
                ((shared_ptr<boost::runtime::basic_param> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                 (shared_ptr<boost::runtime::basic_param> *)in_stack_fffffffffffff908);
      if ((local_99 & 1) != 0) {
        if ((local_1a8[0x60] & 1) == 0) {
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (std_string *)in_stack_fffffffffffff918);
          format_error::format_error
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (cstring *)in_stack_fffffffffffff918);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    (this_01,in_RDI);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
        }
        std::__cxx11::string::size();
        unit_test::basic_cstring<const_char>::trim_left
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff917,
                            CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                   (size_type)in_stack_fffffffffffff908);
      }
      unit_test::basic_cstring<const_char>::size(&local_88);
      unit_test::basic_cstring<const_char>::trim_left
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                 (size_type)in_stack_fffffffffffff908);
      unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      bVar1 = unit_test::basic_cstring<const_char>::is_empty(&local_98);
      if (bVar1) {
        pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->
                           ((shared_ptr<boost::runtime::basic_param> *)
                            CONCAT17(in_stack_fffffffffffff917,
                                     CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)))
        ;
        bVar1 = unit_test::class_property<bool>::operator!
                          (&(pbVar3->p_has_optional_value).super_class_property<bool>);
        if (bVar1) goto LAB_00244e4e;
      }
      else {
LAB_00244e4e:
        bVar1 = unit_test::operator==
                          ((std_string *)
                           CONCAT17(in_stack_fffffffffffff917,
                                    CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                           (basic_cstring<const_char> *)in_stack_fffffffffffff908);
        if (!bVar1) {
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (std_string *)in_stack_fffffffffffff918);
          format_error::format_error
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (cstring *)in_stack_fffffffffffff918);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    (this_01,in_RDI);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          argv_traverser::current_token(in_stack_fffffffffffff918);
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    (this_01,(basic_cstring<const_char> *)in_RDI);
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
        }
        in_stack_fffffffffffff928 =
             (specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *)
             unit_test::basic_cstring<const_char>::size(&local_98);
        unit_test::basic_cstring<const_char>::trim_left
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff917,
                            CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)),
                   (size_type)in_stack_fffffffffffff908);
        unit_test::basic_cstring<const_char>::operator=(local_2b8,&local_68);
        in_stack_fffffffffffff927 = unit_test::basic_cstring<const_char>::is_empty(local_2b8);
        if ((bool)in_stack_fffffffffffff927) {
          argv_traverser::next_token
                    ((argv_traverser *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          argv_traverser::current_token(in_stack_fffffffffffff918);
          unit_test::basic_cstring<const_char>::operator=(local_2b8,local_400);
        }
        in_stack_fffffffffffff926 = unit_test::basic_cstring<const_char>::is_empty(local_2b8);
        if ((bool)in_stack_fffffffffffff926) {
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          unit_test::basic_cstring<const_char>::basic_cstring
                    ((basic_cstring<const_char> *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (std_string *)in_stack_fffffffffffff918);
          format_error::format_error
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                     (cstring *)in_stack_fffffffffffff918);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          shared_ptr<boost::runtime::basic_param>::operator->
                    ((shared_ptr<boost::runtime::basic_param> *)
                     CONCAT17(in_stack_fffffffffffff917,
                              CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    (this_01,in_RDI);
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
          operator<<(in_stack_fffffffffffff928,
                     (char *)CONCAT17(in_stack_fffffffffffff927,
                                      CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920))
                    );
          argv_traverser::current_token(in_stack_fffffffffffff918);
          specific_param_error<boost::runtime::format_error,boost::runtime::input_error>::operator<<
                    (this_01,(basic_cstring<const_char> *)in_RDI);
          unit_test::ut_detail::throw_exception<boost::runtime::format_error>
                    ((format_error *)
                     CONCAT17(in_stack_fffffffffffff927,
                              CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
        }
      }
      in_stack_fffffffffffff918 = local_20;
      shared_ptr<boost::runtime::basic_param>::operator->
                ((shared_ptr<boost::runtime::basic_param> *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffff927,
                          CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                 (std_string *)in_stack_fffffffffffff918);
      in_stack_fffffffffffff917 =
           arguments_store::has
                     ((arguments_store *)
                      CONCAT17(in_stack_fffffffffffff927,
                               CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                      (cstring *)in_stack_fffffffffffff918);
      in_stack_fffffffffffff916 = 1;
      if ((bool)in_stack_fffffffffffff917) {
        pbVar3 = shared_ptr<boost::runtime::basic_param>::operator->
                           ((shared_ptr<boost::runtime::basic_param> *)
                            CONCAT17(in_stack_fffffffffffff917,CONCAT16(1,in_stack_fffffffffffff910)
                                    ));
        in_stack_fffffffffffff916 = pbVar3->p_repeatable;
      }
      if ((in_stack_fffffffffffff916 & 1) == 0) {
        shared_ptr<boost::runtime::basic_param>::operator->
                  ((shared_ptr<boost::runtime::basic_param> *)
                   CONCAT17(in_stack_fffffffffffff917,
                            CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
        unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffff927,
                            CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                   (std_string *)in_stack_fffffffffffff918);
        duplicate_arg::duplicate_arg
                  ((duplicate_arg *)
                   CONCAT17(in_stack_fffffffffffff927,
                            CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)),
                   (cstring *)in_stack_fffffffffffff918);
        specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::operator<<
                  ((specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                    *)in_stack_fffffffffffff928,
                   (char *)CONCAT17(in_stack_fffffffffffff927,
                                    CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
        shared_ptr<boost::runtime::basic_param>::operator->
                  ((shared_ptr<boost::runtime::basic_param> *)
                   CONCAT17(in_stack_fffffffffffff917,
                            CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
        specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::operator<<
                  ((specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                    *)this_01,in_RDI);
        specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>::operator<<
                  ((specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                    *)in_stack_fffffffffffff928,
                   (char *)CONCAT17(in_stack_fffffffffffff927,
                                    CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
        argv_traverser::current_token(in_stack_fffffffffffff918);
        specific_param_error<boost::runtime::duplicate_arg,boost::runtime::input_error>::operator<<
                  ((specific_param_error<boost::runtime::duplicate_arg,_boost::runtime::input_error>
                    *)this_01,(basic_cstring<const_char> *)in_RDI);
        unit_test::ut_detail::throw_exception<boost::runtime::duplicate_arg>
                  ((duplicate_arg *)
                   CONCAT17(in_stack_fffffffffffff927,
                            CONCAT16(in_stack_fffffffffffff926,in_stack_fffffffffffff920)));
      }
      in_stack_fffffffffffff908 =
           shared_ptr<boost::runtime::basic_param>::operator->
                     ((shared_ptr<boost::runtime::basic_param> *)
                      CONCAT17(in_stack_fffffffffffff917,
                               CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      unit_test::basic_cstring<const_char>::basic_cstring(local_690,local_2b8);
      (*in_stack_fffffffffffff908->_vptr_basic_param[3])
                (in_stack_fffffffffffff908,local_690,(ulong)(local_99 & 1),local_20);
      argv_traverser::next_token
                ((argv_traverser *)
                 CONCAT17(in_stack_fffffffffffff917,
                          CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      shared_ptr<boost::runtime::basic_param>::~shared_ptr
                ((shared_ptr<boost::runtime::basic_param> *)0x2454ed);
      std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
      ~pair((pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
             *)CONCAT17(in_stack_fffffffffffff917,
                        CONCAT16(in_stack_fffffffffffff916,in_stack_fffffffffffff910)));
      local_f4 = 0;
    }
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x245512);
  } while( true );
}

Assistant:

int
    parse( int argc, char** argv, runtime::arguments_store& res )
    {
        // save program name for help message
        m_program_name = argv[0];
        cstring path_sep( "\\/" );

        cstring::iterator it = unit_test::utils::find_last_of( m_program_name.begin(), m_program_name.end(),
                                                                path_sep.begin(), path_sep.end() );
        if( it != m_program_name.end() )
            m_program_name.trim_left( it + 1 );

        // Set up the traverser
        argv_traverser tr( argc, (char const**)argv );

        // Loop till we reach end of input
        while( !tr.eoi() ) {
            cstring curr_token = tr.current_token();

            cstring prefix;
            cstring name;
            cstring value_separator;
            bool    negative_form = false;

            // Perform format validations and split the argument into prefix, name and separator
            // False return value indicates end of params indicator is met
            if( !validate_token_format( curr_token, prefix, name, value_separator, negative_form ) ) {
                // get rid of "end of params" token
                tr.next_token();
                break;
            }

            // Locate trie corresponding to found prefix and skip it in the input
            trie_ptr curr_trie = m_param_trie[prefix];

            if( !curr_trie ) {
                //  format_error() << "Unrecognized parameter prefix in the argument " << tr.current_token()
                rt_cla_detail::report_foreing_token( m_program_name, curr_token );
                tr.save_token();
                continue;
            }

            curr_token.trim_left( prefix.size() );

            // Locate parameter based on a name and skip it in the input
            locate_result locate_res = locate_parameter( curr_trie, name, curr_token );
            parameter_cla_id const& found_id    = locate_res.first;
            basic_param_ptr         found_param = locate_res.second;

            if( negative_form ) {
                BOOST_TEST_I_ASSRT( found_id.m_negatable,
                                    format_error( found_param->p_name ) 
                                        << "Parameter tag " << found_id.m_tag << " is not negatable." );

                curr_token.trim_left( m_negation_prefix.size() );
            }

            curr_token.trim_left( name.size() );

            cstring value;

            // Skip validations if parameter has optional value and we are at the end of token
            if( !value_separator.is_empty() || !found_param->p_has_optional_value ) {
                // Validate and skip value separator in the input
                BOOST_TEST_I_ASSRT( found_id.m_value_separator == value_separator,
                                    format_error( found_param->p_name ) 
                                        << "Invalid separator for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );

                curr_token.trim_left( value_separator.size() );

                // Deduce value source
                value = curr_token;
                if( value.is_empty() ) {
                    tr.next_token();
                    value = tr.current_token();
                }

                BOOST_TEST_I_ASSRT( !value.is_empty(),
                                    format_error( found_param->p_name )
                                        << "Missing an argument value for the parameter "
                                        << found_param->p_name
                                        << " in the argument " << tr.current_token() );
            }

            // Validate against argument duplication
            BOOST_TEST_I_ASSRT( !res.has( found_param->p_name ) || found_param->p_repeatable,
                                duplicate_arg( found_param->p_name )
                                    << "Duplicate argument value for the parameter "
                                    << found_param->p_name
                                    << " in the argument " << tr.current_token() );

            // Produce argument value
            found_param->produce_argument( value, negative_form, res );

            tr.next_token();
        }

        // generate the remainder and return it's size
        return tr.remainder();
    }